

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O3

void Cnf_ManStop(Cnf_Man_t *p)

{
  Vec_Int_t *__ptr;
  int *__ptr_00;
  char **__ptr_01;
  
  __ptr = p->vMemory;
  __ptr_00 = __ptr->pArray;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  free(__ptr);
  if (p->pTruths[0] != (uint *)0x0) {
    free(p->pTruths[0]);
    p->pTruths[0] = (uint *)0x0;
  }
  Aig_MmFlexStop(p->pMemCuts,0);
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  __ptr_01 = p->pSops;
  if (__ptr_01[1] != (char *)0x0) {
    free(__ptr_01[1]);
    p->pSops[1] = (char *)0x0;
    __ptr_01 = p->pSops;
    if (__ptr_01 == (char **)0x0) goto LAB_005628d1;
  }
  free(__ptr_01);
LAB_005628d1:
  free(p);
  return;
}

Assistant:

void Cnf_ManStop( Cnf_Man_t * p )
{
    Vec_IntFree( p->vMemory );
    ABC_FREE( p->pTruths[0] );
    Aig_MmFlexStop( p->pMemCuts, 0 );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}